

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O1

void readparameters(uint32 numparams,uint8 *base,uint8 **ptr,uint32 *len,
                   MOJOSHADER_effectParam **params,MOJOSHADER_effectObject *objects,
                   MOJOSHADER_malloc m,void *d)

{
  uint uVar1;
  uint uVar2;
  MOJOSHADER_effectParam *pMVar3;
  uint uVar4;
  uint32 uVar5;
  uint32 typeoffset;
  uint32 valoffset;
  uint32 numannos;
  MOJOSHADER_effectAnnotation **annotations;
  long lVar6;
  
  if (numparams != 0) {
    pMVar3 = (MOJOSHADER_effectParam *)(*m)(numparams * 0x50,d);
    *params = pMVar3;
    lVar6 = 0;
    memset(pMVar3,0,(ulong)(numparams * 0x50));
    do {
      pMVar3 = *params;
      uVar2 = *len;
      uVar1 = 0;
      typeoffset = 0;
      if (3 < uVar2) {
        typeoffset = *(uint32 *)*ptr;
        *ptr = (uint8 *)((long)*ptr + 4);
        uVar1 = uVar2 - 4;
      }
      *len = uVar1;
      uVar2 = 0;
      uVar4 = 0;
      valoffset = 0;
      if (3 < uVar1) {
        valoffset = *(uint32 *)*ptr;
        *ptr = (uint8 *)((long)*ptr + 4);
        uVar4 = uVar1 - 4;
      }
      *len = uVar4;
      if (3 < uVar4) {
        *ptr = *ptr + 4;
        uVar2 = uVar4 - 4;
      }
      *len = uVar2;
      uVar5 = 0;
      numannos = 0;
      if (3 < uVar2) {
        numannos = *(uint32 *)*ptr;
        *ptr = (uint8 *)((long)*ptr + 4);
        uVar5 = uVar2 - 4;
      }
      *len = uVar5;
      annotations = (MOJOSHADER_effectAnnotation **)((long)&pMVar3->annotations + lVar6);
      *(uint32 *)(annotations + -1) = numannos;
      readannotations(numannos,base,ptr,len,annotations,objects,m,d);
      readvalue(base,typeoffset,valoffset,
                (MOJOSHADER_effectValue *)((long)&(pMVar3->value).name + lVar6),objects,m,d);
      lVar6 = lVar6 + 0x50;
    } while ((ulong)numparams * 0x50 != lVar6);
  }
  return;
}

Assistant:

static void readparameters(const uint32 numparams,
                           const uint8 *base,
                           const uint8 **ptr,
                           uint32 *len,
                           MOJOSHADER_effectParam **params,
                           MOJOSHADER_effectObject *objects,
                           MOJOSHADER_malloc m,
                           void *d)
{
    int i;
    if (numparams == 0) return;

    uint32 siz = sizeof(MOJOSHADER_effectParam) * numparams;
    *params = (MOJOSHADER_effectParam *) m(siz, d);
    memset(*params, '\0', siz);

    for (i = 0; i < numparams; i++)
    {
        MOJOSHADER_effectParam *param = &(*params)[i];

        const uint32 typeoffset = readui32(ptr, len);
        const uint32 valoffset = readui32(ptr, len);
        /*const uint32 flags =*/ readui32(ptr, len);
        const uint32 numannos = readui32(ptr, len);

        param->annotation_count = numannos;
        readannotations(numannos, base, ptr, len,
                        &param->annotations, objects,
                        m, d);

        readvalue(base, typeoffset, valoffset,
                  &param->value, objects,
                  m, d);
    } // for
}